

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trainer_interface.cc
# Opt level: O1

void __thiscall
sentencepiece::MultiFileSentenceIterator::MultiFileSentenceIterator
          (MultiFileSentenceIterator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *files)

{
  (this->super_SentenceIterator)._vptr_SentenceIterator =
       (_func_int **)&PTR__MultiFileSentenceIterator_0027d730;
  this->read_done_ = false;
  this->file_index_ = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->files_,files);
  (this->value_)._M_dataplus._M_p = (pointer)&(this->value_).field_2;
  (this->value_)._M_string_length = 0;
  (this->value_).field_2._M_local_buf[0] = '\0';
  (this->fp_)._M_t.
  super___uniq_ptr_impl<sentencepiece::filesystem::ReadableFile,_std::default_delete<sentencepiece::filesystem::ReadableFile>_>
  ._M_t.
  super__Tuple_impl<0UL,_sentencepiece::filesystem::ReadableFile_*,_std::default_delete<sentencepiece::filesystem::ReadableFile>_>
  .super__Head_base<0UL,_sentencepiece::filesystem::ReadableFile_*,_false>._M_head_impl =
       (ReadableFile *)0x0;
  (*(this->super_SentenceIterator)._vptr_SentenceIterator[3])(this);
  return;
}

Assistant:

MultiFileSentenceIterator::MultiFileSentenceIterator(
    const std::vector<std::string> &files)
    : files_(files) {
  Next();
}